

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadDesc(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,Desc *ds)

{
  bool bVar1;
  type_conflict5 tVar2;
  Verbosity VVar3;
  int iVar4;
  Status SVar5;
  int iVar6;
  Status *pSVar7;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  ulong *puVar9;
  SPxId *pSVar10;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **ppSVar11;
  long in_RSI;
  long in_RDI;
  SPxColId id_1;
  SPxRowId id;
  Verbosity old_verbosity;
  bool consistent;
  int j;
  int i;
  SPxId none;
  undefined4 in_stack_fffffffffffffcc8;
  Status in_stack_fffffffffffffccc;
  undefined4 in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  SPxRowId *in_stack_fffffffffffffce8;
  SPxColId *cid;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcf0;
  type_conflict5 local_301;
  type_conflict5 local_2f1;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd10;
  type_conflict5 local_2e1;
  type_conflict5 local_2a9;
  type_conflict5 local_299;
  type_conflict5 local_289;
  DataKey local_26c;
  undefined1 local_264 [8];
  int in_stack_fffffffffffffda4;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffda8;
  undefined1 local_228 [56];
  ulong local_1f0;
  undefined1 local_1e4 [56];
  DataKey local_1ac;
  undefined1 local_1a4 [56];
  undefined4 local_16c;
  undefined1 local_168 [56];
  ulong local_130;
  undefined1 local_124 [56];
  undefined4 local_ec;
  Verbosity local_e8;
  byte local_e1;
  int local_e0;
  int local_dc;
  undefined8 local_d8;
  long local_d0;
  undefined8 local_c0;
  ulong *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined1 *local_80;
  undefined8 local_78;
  ulong *local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  ulong *local_20;
  undefined8 local_18;
  undefined8 local_10;
  ulong *local_8;
  
  local_d0 = in_RSI;
  SPxId::SPxId((SPxId *)0x339cc4);
  local_e1 = 1;
  if ((*(long *)(in_RDI + 0x200) != 0) &&
     (VVar3 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x200)), 4 < (int)VVar3)) {
    local_e8 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x200));
    local_ec = 5;
    (**(code **)(**(long **)(in_RDI + 0x200) + 0x10))(*(long **)(in_RDI + 0x200),&local_ec);
    soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                       (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    (**(code **)(**(long **)(in_RDI + 0x200) + 0x10))(*(long **)(in_RDI + 0x200),&local_e8);
  }
  *(undefined8 *)(in_RDI + 0x164) = local_d8;
  *(undefined8 *)(in_RDI + 0x16c) = local_d8;
  *(undefined4 *)(in_RDI + 0x174) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x100) = 0;
  *(undefined4 *)(in_RDI + 0x10c) = 0;
  if (local_d0 != in_RDI + 0x1b8) {
    Desc::operator=((Desc *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                    (Desc *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    setRep(in_stack_fffffffffffffcd8);
  }
  *(undefined4 *)(in_RDI + 0x114) = 0;
  local_e0 = 0;
  for (local_dc = 0; iVar6 = local_dc,
      iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x339e5b), iVar6 < iVar4; local_dc = local_dc + 1) {
    pSVar7 = Desc::rowStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                             in_stack_fffffffffffffccc);
    if (*pSVar7 < ~P_FREE) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
            in_stack_fffffffffffffccc);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
            in_stack_fffffffffffffccc);
      bVar1 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x339f1b);
      if (bVar1) {
        pSVar7 = Desc::rowStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,
                                                  in_stack_fffffffffffffcd0),
                                 in_stack_fffffffffffffccc);
        *pSVar7 = P_FIXED;
      }
      else {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
              in_stack_fffffffffffffccc);
        puVar9 = (ulong *)infinity();
        local_130 = *puVar9 ^ 0x8000000000000000;
        local_b0 = local_124;
        local_b8 = &local_130;
        local_c0 = 0;
        local_8 = local_b8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (double)in_stack_fffffffffffffcd8,
                   (type *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x339ffe);
        local_289 = false;
        if (tVar2) {
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                in_stack_fffffffffffffccc);
          local_a0 = infinity();
          local_98 = local_168;
          local_a8 = 0;
          local_10 = local_a0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (double)in_stack_fffffffffffffcd8,
                     (type *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          tVar2 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x33a09e);
          local_299 = true;
          if (!tVar2) {
            pSVar7 = Desc::rowStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,
                                                      in_stack_fffffffffffffcd0),
                                     in_stack_fffffffffffffccc);
            local_299 = true;
            if (*pSVar7 != P_ON_LOWER) {
              pSVar7 = Desc::rowStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,
                                                        in_stack_fffffffffffffcd0),
                                       in_stack_fffffffffffffccc);
              local_2a9 = false;
              if (*pSVar7 != P_ON_UPPER) {
                SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::maxRowObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                            in_stack_fffffffffffffccc);
                local_16c = 0;
                local_2a9 = boost::multiprecision::operator<=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)in_stack_fffffffffffffcd8,
                                       (int *)CONCAT44(in_stack_fffffffffffffcd4,
                                                       in_stack_fffffffffffffcd0));
              }
              local_299 = local_2a9;
            }
          }
          local_289 = local_299;
        }
        if (local_289 == false) {
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                in_stack_fffffffffffffccc);
          local_88 = infinity();
          local_80 = local_1a4;
          local_90 = 0;
          local_18 = local_88;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (double)in_stack_fffffffffffffcd8,
                     (type *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          tVar2 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x33a21e);
          if (tVar2) {
            pSVar7 = Desc::rowStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,
                                                      in_stack_fffffffffffffcd0),
                                     in_stack_fffffffffffffccc);
            *pSVar7 = P_ON_UPPER;
          }
          else {
            pSVar7 = Desc::rowStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,
                                                      in_stack_fffffffffffffcd0),
                                     in_stack_fffffffffffffccc);
            *pSVar7 = P_FREE;
          }
        }
        else {
          pSVar7 = Desc::rowStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,
                                                    in_stack_fffffffffffffcd0),
                                   in_stack_fffffffffffffccc);
          *pSVar7 = P_ON_LOWER;
        }
      }
    }
    else {
      SVar5 = dualRowStatus(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
      pSVar7 = Desc::rowStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)
                               ,in_stack_fffffffffffffccc);
      *pSVar7 = SVar5;
    }
    Desc::rowStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                    in_stack_fffffffffffffccc);
    bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                      in_stack_fffffffffffffccc);
    iVar6 = local_e0;
    if (bVar1) {
      iVar4 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
              ::size((DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                      *)(in_RDI + 0x28));
      if (iVar6 == iVar4) {
        local_e1 = 0;
        break;
      }
      local_1ac = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::rId((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4);
      pSVar10 = DataArray<soplex::SPxId>::operator[]
                          ((DataArray<soplex::SPxId> *)(in_RDI + 0x10),local_e0);
      SPxId::operator=(pSVar10,(SPxRowId *)&local_1ac);
      pSVar8 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::vector(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      ppSVar11 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                 ::operator[]((DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                               *)(in_RDI + 0x28),local_e0);
      iVar6 = local_e0;
      *ppSVar11 = pSVar8;
      local_e0 = local_e0 + 1;
      ppSVar11 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                 ::operator[]((DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                               *)(in_RDI + 0x28),iVar6);
      iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(*ppSVar11);
      *(int *)(in_RDI + 0x114) = iVar6 + *(int *)(in_RDI + 0x114);
    }
  }
  local_dc = 0;
  do {
    iVar6 = local_dc;
    iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x33a3e1);
    if (iVar4 <= iVar6) {
LAB_0033a901:
      iVar6 = local_e0;
      iVar4 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
              ::size((DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                      *)(in_RDI + 0x28));
      if (iVar6 < iVar4) {
        local_e1 = 0;
      }
      if ((local_e1 & 1) == 0) {
        restoreInitialBasis(in_stack_fffffffffffffd10);
      }
      else {
        *(undefined1 *)(in_RDI + 0x40) = 1;
      }
      *(undefined1 *)(in_RDI + 0x50) = 0;
      if (*(long *)(in_RDI + 0x48) != 0) {
        (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))();
      }
      return;
    }
    pSVar7 = Desc::colStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                             in_stack_fffffffffffffccc);
    if (*pSVar7 < ~P_FREE) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
              in_stack_fffffffffffffccc);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
              in_stack_fffffffffffffccc);
      bVar1 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x33a492);
      if (bVar1) {
        pSVar7 = Desc::colStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,
                                                  in_stack_fffffffffffffcd0),
                                 in_stack_fffffffffffffccc);
        *pSVar7 = P_FIXED;
      }
      else {
        in_stack_fffffffffffffd10 =
             (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        in_stack_fffffffffffffccc);
        puVar9 = (ulong *)infinity();
        local_1f0 = *puVar9 ^ 0x8000000000000000;
        local_68 = local_1e4;
        local_70 = &local_1f0;
        local_78 = 0;
        local_20 = local_70;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (double)in_stack_fffffffffffffcd8,
                   (type *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x33a56f);
        local_2e1 = false;
        if (tVar2) {
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                  in_stack_fffffffffffffccc);
          local_58 = infinity();
          local_50 = local_228;
          local_60 = 0;
          local_28 = local_58;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (double)in_stack_fffffffffffffcd8,
                     (type *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          tVar2 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x33a606);
          local_2f1 = true;
          if (!tVar2) {
            pSVar7 = Desc::colStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,
                                                      in_stack_fffffffffffffcd0),
                                     in_stack_fffffffffffffccc);
            local_2f1 = true;
            if (*pSVar7 != P_ON_LOWER) {
              pSVar7 = Desc::colStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,
                                                        in_stack_fffffffffffffcd0),
                                       in_stack_fffffffffffffccc);
              local_301 = false;
              if (*pSVar7 != P_ON_UPPER) {
                SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                         in_stack_fffffffffffffccc);
                local_301 = boost::multiprecision::operator<=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)in_stack_fffffffffffffcd8,
                                       (int *)CONCAT44(in_stack_fffffffffffffcd4,
                                                       in_stack_fffffffffffffcd0));
              }
              local_2f1 = local_301;
            }
          }
          local_2e1 = local_2f1;
        }
        if (local_2e1 == false) {
          in_stack_fffffffffffffcf0 =
               (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                          in_stack_fffffffffffffccc);
          local_40 = infinity();
          local_38 = local_264;
          local_48 = 0;
          local_30 = local_40;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (double)in_stack_fffffffffffffcd8,
                     (type *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          tVar2 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x33a765);
          if (tVar2) {
            pSVar7 = Desc::colStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,
                                                      in_stack_fffffffffffffcd0),
                                     in_stack_fffffffffffffccc);
            *pSVar7 = P_ON_UPPER;
          }
          else {
            pSVar7 = Desc::colStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,
                                                      in_stack_fffffffffffffcd0),
                                     in_stack_fffffffffffffccc);
            *pSVar7 = P_FREE;
          }
        }
        else {
          pSVar7 = Desc::colStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,
                                                    in_stack_fffffffffffffcd0),
                                   in_stack_fffffffffffffccc);
          *pSVar7 = P_ON_LOWER;
        }
      }
    }
    else {
      SVar5 = dualColStatus(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
      pSVar7 = Desc::colStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)
                               ,in_stack_fffffffffffffccc);
      *pSVar7 = SVar5;
    }
    cid = *(SPxColId **)(in_RDI + 8);
    Desc::colStatus((Desc *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                    in_stack_fffffffffffffccc);
    bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                      in_stack_fffffffffffffccc);
    if (bVar1) {
      in_stack_fffffffffffffce4 = local_e0;
      iVar6 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
              ::size((DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                      *)(in_RDI + 0x28));
      if (in_stack_fffffffffffffce4 == iVar6) {
        local_e1 = 0;
        goto LAB_0033a901;
      }
      local_26c = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::cId((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4);
      pSVar10 = DataArray<soplex::SPxId>::operator[]
                          ((DataArray<soplex::SPxId> *)(in_RDI + 0x10),local_e0);
      SPxId::operator=(pSVar10,(SPxColId *)&local_26c);
      in_stack_fffffffffffffcd8 =
           (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::vector(in_stack_fffffffffffffcf0,cid);
      ppSVar11 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                 ::operator[]((DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                               *)(in_RDI + 0x28),local_e0);
      iVar6 = local_e0;
      *ppSVar11 = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffffcd8;
      local_e0 = local_e0 + 1;
      ppSVar11 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                 ::operator[]((DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                               *)(in_RDI + 0x28),iVar6);
      iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(*ppSVar11);
      *(int *)(in_RDI + 0x114) = iVar6 + *(int *)(in_RDI + 0x114);
    }
    local_dc = local_dc + 1;
  } while( true );
}

Assistant:

void SPxBasisBase<R>::loadDesc(const Desc& ds)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);
   assert(ds.nRows() == theLP->nRows());
   assert(ds.nCols() == theLP->nCols());

   SPxId none;
   int   i;
   int   j;
   bool consistent = true;

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS02 loading of Basis invalidates factorization"
                 << std::endl;)

   lastin      = none;
   lastout     = none;
   lastidx     = -1;
   iterCount   = 0;
   updateCount = 0;

   if(&ds != &thedesc)
   {
      thedesc = ds;
      setRep();
   }

   assert(theLP->dim() == matrix.size());

   nzCount = 0;

   for(j = i = 0; i < theLP->nRows(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.rowStatus(i) >= 0)
         thedesc.rowStatus(i) = dualRowStatus(i);
      else if(theLP->SPxLPBase<R>::lhs(i) == theLP->SPxLPBase<R>::rhs(i))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lhs(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::rhs(i) >= R(infinity)
                  || thedesc.rowStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.rowStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxRowObj(i) <= 0)))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::rhs(i) < R(infinity))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.rowStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxRowId id = theLP->SPxLPBase<R>::rId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   for(i = 0; i < theLP->nCols(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.colStatus(i) >= 0)
         thedesc.colStatus(i) = dualColStatus(i);
      else if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::upper(i) >= R(infinity)
                  || thedesc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.colStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxObj(i) <= 0)))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::upper(i) < R(infinity))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.colStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxColId id = theLP->SPxLPBase<R>::cId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   if(j < matrix.size())
      consistent = false;  // not enough basic variables

   /* if dimensions are inconsistent, restore slack basis
    * if dimensions are consistent, then we have setup a correct matrix
    */
   if(!consistent)
      restoreInitialBasis();
   else
      matrixIsSetup = true;

   assert(isDescValid(thedesc));

   factorized = false;

   if(factor != nullptr)
      factor->clear();
}